

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 150_evaluateReversePolishNums.cpp
# Opt level: O0

int main(void)

{
  vector<int,_std::allocator<int>_> avStack_178 [10];
  vector<int,_std::allocator<int>_> vStack_88;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  long local_48;
  vector<int,_std::allocator<int>_> *local_40;
  value_type local_24;
  long lStack_20;
  int i;
  unsigned_long __vla_expr0;
  int local_10;
  int local_c;
  int n;
  
  __vla_expr0 = (unsigned_long)&vStack_88;
  local_c = 0;
  local_10 = 10;
  local_48 = 10;
  local_50 = avStack_178;
  local_58 = &vStack_88;
  local_40 = local_50;
  lStack_20 = local_48;
  do {
    local_60 = local_50;
    std::vector<int,_std::allocator<int>_>::vector(local_50);
    local_50 = local_60 + 1;
  } while (local_50 != local_58);
  for (local_24 = 0; local_24 < local_10; local_24 = local_24 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back(local_40 + local_24,&local_24);
  }
  local_70 = local_40 + local_48;
  if (local_40 != local_70) {
    do {
      vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(local_70 + -1);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      local_70 = (vector<int,_std::allocator<int>_> *)
                 vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    } while ((vector<int,_std::allocator<int>_> *)
             vStack_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage != local_40);
  }
  return local_c;
}

Assistant:

int main()
{
	// string s1 = "+";
	// if (s1=="+")
	// 	cout<<"TTT"<<endl;
	// vector<string> v = {"9","10","2"};
	// sort(v.begin(),v.end());
	// for (auto s : v)
	// 	cout<<s;
	int n = 10;
	vector<int> adj[n];
	for (int i=0;i<n;i++)
	{
		adj[i].push_back(i);
	}

	// cout<<stoi(s1)<<endl;
}